

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_400578::CpuIntegrationTest_nmi_Test::TestBody(CpuIntegrationTest_nmi_Test *this)

{
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  *this_00;
  CpuRegisters *lhs;
  CpuRegisters *rhs;
  uint8_t *puVar1;
  mapped_type mVar2;
  IMos6502 *pIVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  mapped_type *pmVar6;
  char cVar7;
  short sVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  allocator_type local_59;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined2 local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  pointer local_38;
  
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6044ce800a000a2;
  local_50 = 0;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,__l,&local_59);
  pbVar5 = local_40;
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT62(local_48._2_6_,CONCAT11(local_48[1],local_48[0]));
  if (pbVar10 != local_40) {
    sVar8 = 0x600;
    do {
      mVar2 = *(mapped_type *)&(pbVar10->_M_dataplus)._M_p;
      local_68.data_._0_2_ = sVar8;
      pmVar6 = std::
               map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
               ::operator[](&(this->super_CpuIntegrationTest).mmu.memory_,(key_type *)&local_68);
      sVar8 = sVar8 + 1;
      *pmVar6 = mVar2;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar10->_M_dataplus)._M_p + 1);
    } while (pbVar10 != pbVar5);
  }
  pvVar4 = (void *)CONCAT62(local_48._2_6_,CONCAT11(local_48[1],local_48[0]));
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_38 - (long)pvVar4);
  }
  local_58._M_head_impl._0_4_ = 0x40c8;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,__l_00,&local_59);
  pbVar5 = local_40;
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT62(local_48._2_6_,CONCAT11(local_48[1],local_48[0]));
  if (pbVar10 != local_40) {
    sVar8 = 0x1000;
    do {
      mVar2 = *(mapped_type *)&(pbVar10->_M_dataplus)._M_p;
      local_68.data_._0_2_ = sVar8;
      pmVar6 = std::
               map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
               ::operator[](&(this->super_CpuIntegrationTest).mmu.memory_,(key_type *)&local_68);
      sVar8 = sVar8 + 1;
      *pmVar6 = mVar2;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar10->_M_dataplus)._M_p + 1);
    } while (pbVar10 != pbVar5);
  }
  pvVar4 = (void *)CONCAT62(local_48._2_6_,CONCAT11(local_48[1],local_48[0]));
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_38 - (long)pvVar4);
  }
  local_48[0] = (internal)0xfc;
  local_48[1] = 0xff;
  this_00 = &(this->super_CpuIntegrationTest).mmu.memory_;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = '\0';
  local_48[0] = (internal)0xfd;
  local_48[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = '\x06';
  local_48[0] = (internal)0xfe;
  local_48[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = 0xad;
  local_48[0] = (internal)0xff;
  local_48[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = 0xde;
  local_48[0] = (internal)0xfa;
  local_48[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = '\0';
  local_48[0] = (internal)0xfb;
  local_48[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_48);
  *pmVar6 = '\x10';
  lhs = &(this->super_CpuIntegrationTest).expected;
  (this->super_CpuIntegrationTest).expected.x = '\x05';
  (this->super_CpuIntegrationTest).expected.y = '\0';
  (this->super_CpuIntegrationTest).expected.pc = 0x604;
  (*(((this->super_CpuIntegrationTest).cpu._M_t.
      super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t
      .super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
      super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu[3]
  )();
  cVar7 = '\x1d';
  do {
    (*(((this->super_CpuIntegrationTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  rhs = &(this->super_CpuIntegrationTest).registers;
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_48,"expected","registers",lhs,rhs);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x126,pcVar9);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  cVar7 = '\x04';
  do {
    (*(((this->super_CpuIntegrationTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  pIVar3 = (this->super_CpuIntegrationTest).cpu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
           .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl;
  (*(pIVar3->super_ICpu)._vptr_ICpu[5])(pIVar3,1);
  (this->super_CpuIntegrationTest).expected.x = '\x06';
  (*(((this->super_CpuIntegrationTest).cpu._M_t.
      super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t
      .super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
      super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu[2]
  )();
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_48,"expected","registers",lhs,rhs);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x12f,pcVar9);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  (this->super_CpuIntegrationTest).expected.y = '\x01';
  (this->super_CpuIntegrationTest).expected.pc = 0x604;
  puVar1 = &(this->super_CpuIntegrationTest).expected.p;
  *puVar1 = *puVar1 | 0x20;
  cVar7 = '\x0f';
  do {
    (*(((this->super_CpuIntegrationTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_48,"expected","registers",lhs,rhs);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x136,pcVar9);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, nmi) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    e8        INX
    // $0605    4c 04 06  JMP $0604
    // nmi:
    // $1000    c8        INY
    // $1001    40        RTI
    load_hex_dump(0x0600,
            {0xa2, 0x00, 0xa0, 0x00, 0xe8, 0x4c, 0x04, 0x06, 0x00, 0x00});
    load_hex_dump(0x1000, {0xc8, 0x40, 0x00, 0x00});

    set_reset_address(0x0600);
    set_break_address(0xDEAD);
    set_nmi_address(0x1000);

    expected.x = 0x05;
    expected.y = 0x00;
    expected.pc = 0x0604;

    cpu->reset();
    // Run the loop 5 times to increase x
    step_execution(2 + 2 + (2 + 3) * 5); // ldx + ldy + (inx + jmp) * 5
    EXPECT_EQ(expected, registers);

    // Before jmp is finised, trigger an nmi
    step_execution(2 + 3 - 1); // inx + jmp - 1
    cpu->set_nmi(true);

    // jmp should finish before jumping to nmi
    expected.x = 0x06;
    step_execution(1);
    EXPECT_EQ(expected, registers);

    // Run rti subroutine and jump back
    expected.y = 0x01;
    expected.pc = 0x0604;
    expected.p |= FLAG_5;
    step_execution(7 + 2 + 6); // nmi + iny + rti
    EXPECT_EQ(expected, registers);
}